

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_utility.cpp
# Opt level: O0

void FCanvasTextureInfo::Serialize(FSerializer *arc)

{
  bool bVar1;
  FSerializer *pFVar2;
  FTextureID local_28;
  int local_24;
  FTextureID picnum;
  int fov;
  AActor *viewpoint;
  FCanvasTextureInfo *probe;
  FSerializer *arc_local;
  
  bVar1 = FSerializer::isWriting(arc);
  if (bVar1) {
    if ((List != (FCanvasTextureInfo *)0x0) &&
       (bVar1 = FSerializer::BeginArray(arc,"canvastextures"), bVar1)) {
      for (viewpoint = (AActor *)List; viewpoint != (AActor *)0x0;
          viewpoint = (AActor *)(viewpoint->super_DThinker).super_DObject._vptr_DObject) {
        if ((((viewpoint->super_DThinker).super_DObject.ObjNext != (DObject *)0x0) &&
            (bVar1 = TObjPtr<AActor>::operator!=
                               ((TObjPtr<AActor> *)&(viewpoint->super_DThinker).super_DObject.Class,
                                (AActor *)0x0), bVar1)) &&
           (bVar1 = FSerializer::BeginObject(arc,(char *)0x0), bVar1)) {
          pFVar2 = FSerializer::operator()
                             (arc,"viewpoint",
                              (TObjPtr<AActor> *)&(viewpoint->super_DThinker).super_DObject.Class);
          pFVar2 = FSerializer::operator()
                             (pFVar2,"fov",
                              (int *)((long)&(viewpoint->super_DThinker).super_DObject.GCNext + 4));
          pFVar2 = FSerializer::operator()
                             (pFVar2,"texture",
                              (FTextureID *)&(viewpoint->super_DThinker).super_DObject.GCNext);
          FSerializer::EndObject(pFVar2);
        }
      }
      FSerializer::EndArray(arc);
    }
  }
  else {
    bVar1 = FSerializer::BeginArray(arc,"canvastextures");
    if (bVar1) {
      FTextureID::FTextureID(&local_28);
      while (bVar1 = FSerializer::BeginObject(arc,(char *)0x0), bVar1) {
        pFVar2 = FSerializer::operator()(arc,"viewpoint",(AActor **)&picnum);
        pFVar2 = FSerializer::operator()(pFVar2,"fov",&local_24);
        pFVar2 = FSerializer::operator()(pFVar2,"texture",&local_28);
        FSerializer::EndObject(pFVar2);
        Add(_picnum,local_28,local_24);
      }
      FSerializer::EndArray(arc);
    }
  }
  return;
}

Assistant:

void FCanvasTextureInfo::Serialize(FSerializer &arc)
{
	if (arc.isWriting())
	{
		if (List != nullptr)
		{
			if (arc.BeginArray("canvastextures"))
			{
				FCanvasTextureInfo *probe;

				for (probe = List; probe != nullptr; probe = probe->Next)
				{
					if (probe->Texture != nullptr && probe->Viewpoint != nullptr)
					{
						if (arc.BeginObject(nullptr))
						{
							arc("viewpoint", probe->Viewpoint)
								("fov", probe->FOV)
								("texture", probe->PicNum)
								.EndObject();
						}
					}
				}
				arc.EndArray();
			}
		}
	}
	else
	{
		if (arc.BeginArray("canvastextures"))
		{
			AActor *viewpoint;
			int fov;
			FTextureID picnum;
			while (arc.BeginObject(nullptr))
			{
				arc("viewpoint", viewpoint)
					("fov", fov)
					("texture", picnum)
					.EndObject();
				Add(viewpoint, picnum, fov);
			}
			arc.EndArray();
		}
	}
}